

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,expected<int,_int> *v)

{
  ostream *poVar1;
  uint *puVar2;
  int value;
  bool local_42;
  allocator<char> local_41;
  string local_40;
  expected *local_20;
  expected<int,_int> *v_local;
  ostream *os_local;
  
  local_20 = (expected *)v;
  v_local = (expected<int,_int> *)os;
  poVar1 = std::operator<<(os,"[expected:");
  local_42 = nonstd::expected_lite::expected::operator_cast_to_bool(local_20);
  if (local_42) {
    puVar2 = (uint *)nonstd::expected_lite::expected<int,_int>::operator*
                               ((expected<int,_int> *)local_20);
    to_string_abi_cxx11_(&local_40,(lest *)(ulong)*puVar2,value);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"[empty]",&local_41);
  }
  local_42 = !local_42;
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_40);
  if (local_42) {
    std::allocator<char>::~allocator(&local_41);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}